

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O1

void __thiscall kratos::Generator::~Generator(Generator *this)

{
  ~Generator(this);
  operator_delete(this,0x568);
  return;
}

Assistant:

~Generator() override = default;